

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# audio_io.c
# Opt level: O1

ALLEGRO_SAMPLE * al_load_sample(char *filename)

{
  char cVar1;
  char *ext;
  ACODEC_TABLE *pAVar2;
  ALLEGRO_SAMPLE *pAVar3;
  
  ext = strrchr(filename,0x2e);
  if (ext == (char *)0x0) {
    cVar1 = _al_trace_prefix("audio",3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/audio_io.c"
                             ,0x104,"al_load_sample");
    if (cVar1 != '\0') {
      _al_trace_suffix("Unable to determine extension for %s.\n",filename);
    }
  }
  else {
    pAVar2 = find_acodec_table_entry(ext);
    if ((pAVar2 != (ACODEC_TABLE *)0x0) &&
       (pAVar2->loader != (_func_ALLEGRO_SAMPLE_ptr_char_ptr *)0x0)) {
      pAVar3 = (*pAVar2->loader)(filename);
      return pAVar3;
    }
    cVar1 = _al_trace_prefix("audio",3,
                             "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/audio_io.c"
                             ,0x10d,"al_load_sample");
    if (cVar1 != '\0') {
      _al_trace_suffix("No handler for audio file extension %s - therefore not trying to load %s.\n"
                       ,ext,filename);
    }
  }
  return (ALLEGRO_SAMPLE *)0x0;
}

Assistant:

ALLEGRO_SAMPLE *al_load_sample(const char *filename)
{
   const char *ext;
   ACODEC_TABLE *ent;

   ASSERT(filename);
   ext = strrchr(filename, '.');
   if (ext == NULL) {
      ALLEGRO_ERROR("Unable to determine extension for %s.\n", filename);
      return NULL;
   }

   ent = find_acodec_table_entry(ext);
   if (ent && ent->loader) {
      return (ent->loader)(filename);
   }
   else {
      ALLEGRO_ERROR("No handler for audio file extension %s - "
         "therefore not trying to load %s.\n", ext, filename);
   }

   return NULL;
}